

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3_error_offset(sqlite3 *db)

{
  int iVar1;
  int iVar2;
  
  iVar2 = -1;
  if (db != (sqlite3 *)0x0) {
    iVar1 = sqlite3SafetyCheckSickOrOk(db);
    if ((iVar1 != 0) && (db->errCode != 0)) {
      if (db->mutex == (sqlite3_mutex *)0x0) {
        iVar2 = db->errByteOffset;
      }
      else {
        (*sqlite3Config.mutex.xMutexEnter)(db->mutex);
        iVar2 = db->errByteOffset;
        if (db->mutex != (sqlite3_mutex *)0x0) {
          (*sqlite3Config.mutex.xMutexLeave)(db->mutex);
        }
      }
    }
  }
  return iVar2;
}

Assistant:

SQLITE_API int sqlite3_error_offset(sqlite3 *db){
  int iOffset = -1;
  if( db && sqlite3SafetyCheckSickOrOk(db) && db->errCode ){
    sqlite3_mutex_enter(db->mutex);
    iOffset = db->errByteOffset;
    sqlite3_mutex_leave(db->mutex);
  }
  return iOffset;
}